

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O0

int convolution_segment_set_out
              (uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  convolution_segment_data *data;
  mixed_segment *segment_local;
  void *buffer_local;
  uint32_t location_local;
  uint32_t field_local;
  
  if (field == 0) {
    if (location == 0) {
      *(void **)((long)segment->data + 8) = buffer;
      location_local = 1;
    }
    else {
      mixed_err(6);
      location_local = 0;
    }
  }
  else {
    mixed_err(7);
    location_local = 0;
  }
  return location_local;
}

Assistant:

int convolution_segment_set_out(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct convolution_segment_data *data = (struct convolution_segment_data *)segment->data;

  switch(field){
  case MIXED_BUFFER:
    if(location == 0){
      data->out = (struct mixed_buffer *)buffer;
      return 1;
    }
    mixed_err(MIXED_INVALID_LOCATION);
    return 0;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}